

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

void ts_parser__breakdown_lookahead
               (TSParser *self,Subtree *lookahead,TSStateId state,ReusableNode *reusable_node)

{
  int32_t *piVar1;
  SubtreePool *pool;
  byte bVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  void *__ptr;
  TSLanguage *self_00;
  int iVar6;
  StackSliceArray SVar7;
  uint32_t uVar8;
  Subtree *pSVar9;
  StackVersion SVar10;
  _Bool _Var11;
  TSStateId state_00;
  StackEntry *__ptr_00;
  long lVar12;
  Subtree SVar13;
  void *pvVar14;
  MutableSubtree left;
  uint32_t uVar15;
  char *pcVar16;
  ulong uVar17;
  uint extraout_EDX;
  int iVar18;
  uint32_t uVar19;
  undefined6 in_register_00000012;
  ushort uVar20;
  StackVersion version1;
  undefined8 *__size;
  int iVar21;
  ulong uVar22;
  ulong uVar23;
  TSSymbol symbol;
  uint uVar24;
  TSParser *pTVar25;
  MutableSubtree MVar26;
  SubtreeHeapData *pSVar27;
  undefined8 *puVar28;
  undefined8 in_R8;
  uint in_R9D;
  uint uVar29;
  StackSlice *pSVar30;
  StackSlice *pSVar31;
  int iVar32;
  TSParser *__size_00;
  bool bVar33;
  byte bVar34;
  StackSliceArray SVar35;
  ulong uStack_190;
  TableEntry TStack_168;
  undefined8 uStack_158;
  StackSlice *pSStack_150;
  SubtreeArray SStack_148;
  undefined8 uStack_138;
  undefined8 uStack_128;
  undefined8 uStack_120;
  StackVersion SStack_114;
  uint uStack_110;
  int iStack_10c;
  SubtreeArray SStack_108;
  ulong uStack_f0;
  StackSlice *pSStack_e8;
  undefined8 *puStack_e0;
  ulong uStack_d8;
  ulong uStack_d0;
  void *pvStack_c8;
  TSParser *pTStack_c0;
  code *pcStack_b8;
  int iStack_ac;
  char cStack_a8;
  undefined8 *puStack_78;
  ulong uStack_70;
  SubtreeHeapData *pSStack_68;
  TSParser *pTStack_60;
  ReusableNode *pRStack_58;
  code *pcStack_50;
  uint local_44;
  Subtree *local_40;
  char *local_38;
  
  bVar34 = 0;
  uVar17 = CONCAT62(in_register_00000012,state) & 0xffffffff;
  uVar4 = (reusable_node->stack).size;
  if (uVar4 == 0) {
    SVar13.ptr = (SubtreeHeapData *)0x0;
  }
  else {
    SVar13 = (Subtree)(reusable_node->stack).contents[uVar4 - 1].tree.ptr;
  }
  if (((ulong)SVar13.ptr & 1) == 0) {
    if ((SVar13.ptr)->child_count == 0) {
      bVar33 = false;
    }
    else {
      local_38 = (self->lexer).debug_buffer;
      bVar33 = false;
      local_44 = (uint)CONCAT62(in_register_00000012,state);
      local_40 = lookahead;
      do {
        if ((SVar13.ptr)->parse_state == (TSStateId)uVar17) break;
        if (((self->lexer).logger.log != (_func_void_void_ptr_TSLogType_char_ptr *)0x0) ||
           (self->dot_graph_file != (FILE *)0x0)) {
          uVar20 = (SVar13.ptr)->symbol;
          pcVar16 = "ERROR";
          if (uVar20 != 0xffff) {
            if (uVar20 == 0xfffe) {
              pcVar16 = "_ERROR";
            }
            else {
              pcVar16 = self->language->symbol_names[uVar20];
            }
          }
          pcStack_50 = (code *)0x137201;
          snprintf(local_38,0x400,"state_mismatch sym:%s",pcVar16);
          pcStack_50 = (code *)0x137209;
          ts_parser__log(self);
          uVar4 = (reusable_node->stack).size;
        }
        if (uVar4 == 0) {
          pcStack_50 = (code *)0x137335;
          __assert_fail("(uint32_t)(&self->stack)->size - 1 < (&self->stack)->size",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/third_party/tree-sitter/src/runtime/reusable_node.h"
                        ,0x48,"_Bool reusable_node_descend(ReusableNode *)");
        }
        __ptr_00 = (reusable_node->stack).contents;
        pSVar27 = __ptr_00[uVar4 - 1].tree.ptr;
        if ((((ulong)pSVar27 & 1) == 0) && (pSVar27->child_count != 0)) {
          uVar5 = __ptr_00[uVar4 - 1].byte_offset;
          uVar17 = (ulong)uVar5;
          if (uVar4 == (reusable_node->stack).capacity) {
            uVar29 = uVar4 * 2;
            if (uVar4 * 2 < 9) {
              uVar29 = 8;
            }
            uVar22 = (ulong)uVar29;
            lookahead = local_40;
            if (uVar4 < uVar29) {
              __size = (undefined8 *)(uVar22 << 4);
              pcStack_50 = (code *)0x137262;
              __ptr_00 = (StackEntry *)realloc(__ptr_00,(size_t)__size);
              iVar21 = (int)in_R8;
              if (__ptr_00 == (StackEntry *)0x0) {
                pcStack_50 = reusable_node_advance;
                puVar28 = __size;
                ts_parser__breakdown_lookahead_cold_1();
                iVar18 = *(int *)(puVar28 + 1);
                puStack_78 = __size;
                uStack_70 = uVar17;
                pSStack_68 = pSVar27;
                pTStack_60 = self;
                pRStack_58 = reusable_node;
                pcStack_50 = (code *)uVar22;
                if (iVar18 == 0) {
                  pcStack_b8 = (code *)0x1374d1;
                  __assert_fail("(uint32_t)(&self->stack)->size - 1 < (&self->stack)->size",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/third_party/tree-sitter/src/runtime/reusable_node.h"
                                ,0x31,"void reusable_node_advance(ReusableNode *)");
                }
                __ptr = (void *)*puVar28;
                lVar12 = (ulong)(iVar18 - 1) * 0x10;
                SVar13 = (Subtree)((Subtree *)((long)__ptr + lVar12))->ptr;
                if (((ulong)SVar13.ptr & 1) == 0) {
                  uVar4 = ((Length *)((long)SVar13 + 4))->bytes;
                  uVar5 = ((Length *)((long)SVar13 + 0x10))->bytes;
                }
                else {
                  uVar4 = SVar13._2_4_ & 0xff;
                  uVar5 = SVar13._3_4_ & 0xff;
                }
                iVar3 = *(int *)((long)__ptr + lVar12 + 0xc);
                if ((((ulong)SVar13.ptr & 1) == 0) && (((SVar13.ptr)->field_0x2c & 0x40) != 0)) {
                  pcStack_b8 = (code *)0x1373ba;
                  SVar13 = ts_subtree_last_external_token(SVar13);
                  *(Subtree *)(puVar28 + 2) = SVar13;
                }
                iStack_ac = iVar3 + uVar4 + uVar5;
                uVar4 = iVar18 * 2;
                uVar15 = iVar18 + 1;
                do {
                  uVar19 = uVar15;
                  uVar5 = uVar19 - 2;
                  uVar17 = (ulong)uVar5;
                  *(uint *)(puVar28 + 1) = uVar5;
                  if (uVar19 == 2) {
                    return;
                  }
                  if (uVar5 <= uVar19 - 3) {
                    pcStack_b8 = (code *)0x1374b2;
                    __assert_fail("(uint32_t)(&self->stack)->size - 1 < (&self->stack)->size",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/third_party/tree-sitter/src/runtime/reusable_node.h"
                                  ,0x3d,"void reusable_node_advance(ReusableNode *)");
                  }
                  uVar22 = *(ulong *)((long)__ptr + (ulong)(uVar19 - 3) * 0x10);
                  uVar5 = 0;
                  if ((uVar22 & 1) == 0) {
                    uVar5 = *(uint *)(uVar22 + 0x24);
                  }
                  uVar29 = *(int *)((long)__ptr + uVar17 * 0x10 + 8) + 1;
                  uVar15 = uVar19 - 1;
                  uVar4 = uVar4 - 2;
                } while (uVar5 <= uVar29);
                pvVar14 = __ptr;
                if (uVar15 - *(int *)((long)puVar28 + 0xc) != 1) {
LAB_00137463:
                  *(uint32_t *)(puVar28 + 1) = uVar15;
                  lVar12 = uVar17 * 0x10;
                  *(undefined8 *)((long)pvVar14 + lVar12) =
                       *(undefined8 *)(*(long *)(uVar22 + 0x30) + (ulong)uVar29 * 8);
                  *(uint *)((long)pvVar14 + lVar12 + 8) = uVar29;
                  *(int *)((long)pvVar14 + lVar12 + 0xc) = iStack_ac;
                  return;
                }
                uVar23 = 8;
                if (8 < uVar4) {
                  uVar23 = (ulong)uVar4;
                }
                if ((uint)uVar23 <= uVar19 - 2) goto LAB_00137463;
                __size_00 = (TSParser *)(uVar23 << 4);
                pcStack_b8 = (code *)0x137447;
                pTVar25 = __size_00;
                pvVar14 = realloc(__ptr,(size_t)__size_00);
                SStack_114 = (StackVersion)pTVar25;
                if (pvVar14 != (void *)0x0) {
                  *puVar28 = pvVar14;
                  *(uint *)((long)puVar28 + 0xc) = (uint)uVar23;
                  uVar17 = (ulong)*(uint *)(puVar28 + 1);
                  uVar15 = *(uint *)(puVar28 + 1) + 1;
                  goto LAB_00137463;
                }
                pcStack_b8 = ts_parser__reduce;
                pTVar25 = __size_00;
                reusable_node_advance_cold_1();
                uVar4 = (pTVar25->stack->heads).size;
                iStack_10c = iVar21;
                puStack_e0 = puVar28;
                uStack_d8 = uVar22;
                uStack_d0 = (ulong)uVar29;
                pvStack_c8 = __ptr;
                pTStack_c0 = __size_00;
                pcStack_b8 = (code *)uVar23;
                SVar35 = ts_stack_pop_count(pTVar25->stack,SStack_114,uVar15);
                uVar15 = SVar35.size;
                if (uVar15 == 0) {
                  return;
                }
                pool = &pTVar25->tree_pool;
                uStack_110 = in_R9D & 0xffff;
                pSStack_e8 = SVar35.contents + 1;
                uStack_f0 = (ulong)(2 - uVar15);
                iVar21 = 0;
                uStack_190 = 0;
                SVar7 = SVar35;
                do {
                  uStack_128 = SVar7._8_8_;
                  pSStack_150 = SVar7.contents;
                  pSVar30 = SVar35.contents;
                  iVar18 = (int)uStack_190;
                  uStack_138 = *(undefined8 *)&pSVar30[uStack_190].version;
                  pSVar31 = pSVar30 + uStack_190;
                  SStack_148.contents = (pSVar31->subtrees).contents;
                  SStack_148.size = (pSVar31->subtrees).size;
                  SStack_148.capacity = (pSVar31->subtrees).capacity;
                  uVar29 = (int)uStack_138 - iVar21;
                  uVar5 = SVar35.size;
                  if ((iVar18 == 0) || (uVar29 < 0xb)) {
                    uVar17 = SStack_148._8_8_ & 0xffffffff;
                    SStack_108.size = 0;
                    if (uVar17 != 0) {
                      do {
                        uVar22 = uVar17 - 1;
                        pSVar27 = SStack_148.contents[uVar22 & 0xffffffff].ptr;
                        if (((ulong)pSVar27 & 1) == 0) {
                          uVar24 = *(uint *)&pSVar27->field_0x2c >> 2;
                        }
                        else {
                          uVar24 = (uint)((ulong)pSVar27 >> 3) & 0x1fffffff;
                        }
                        if ((uVar24 & 1) == 0) {
                          SStack_108.size = (uint32_t)uVar17;
                          break;
                        }
                        uVar17 = uVar22;
                      } while ((int)uVar22 != 0);
                    }
                    SStack_108.capacity = SStack_148.capacity;
                    symbol = (TSSymbol)extraout_EDX;
                    uStack_120 = uStack_138;
                    SStack_108.contents = SStack_148.contents;
                    left = ts_subtree_new_node(pool,symbol,&SStack_108,uStack_110,pTVar25->language)
                    ;
                    if (iVar18 + 1U < uVar5) {
                      uVar17 = (ulong)(iVar18 + 1U);
                      do {
                        uVar22 = uVar17;
                        uStack_158 = *(undefined8 *)&pSVar30[uVar22].version;
                        pSVar31 = pSVar30 + uVar22;
                        TStack_168.actions = (TSParseAction *)(pSVar31->subtrees).contents;
                        TStack_168.action_count = (pSVar31->subtrees).size;
                        TStack_168._12_4_ = (pSVar31->subtrees).capacity;
                        if ((int)uStack_158 != (int)uStack_138) break;
                        uVar17 = TStack_168._8_8_ & 0xffffffff;
                        uVar19 = TStack_168.action_count + 1;
                        do {
                          bVar33 = uVar17 == 0;
                          uVar17 = uVar17 - 1;
                          if (bVar33) {
                            uVar19 = 0;
                            break;
                          }
                          pSVar27 = ((Subtree *)TStack_168.actions)[uVar17].ptr;
                          if (((ulong)pSVar27 & 1) == 0) {
                            uVar24 = *(uint *)&pSVar27->field_0x2c >> 2;
                          }
                          else {
                            uVar24 = (uint)((ulong)pSVar27 >> 3) & 0x1fffffff;
                          }
                          uVar19 = uVar19 - 1;
                        } while ((uVar24 & 1) != 0);
                        MVar26 = left;
                        pSVar27 = (pTVar25->scratch_tree).ptr;
                        for (lVar12 = 0xb; lVar12 != 0; lVar12 = lVar12 + -1) {
                          uVar8 = ((Length *)((long)MVar26 + 4))->bytes;
                          pSVar27->ref_count = *(uint32_t *)MVar26;
                          (pSVar27->padding).bytes = uVar8;
                          MVar26.data = MVar26.data + (ulong)bVar34 * -0x10 + 8;
                          pSVar27 = (SubtreeHeapData *)((long)pSVar27 + (ulong)bVar34 * -0x10 + 8);
                        }
                        ((pTVar25->scratch_tree).ptr)->child_count = 0;
                        ts_subtree_set_children
                                  (pTVar25->scratch_tree,(Subtree *)TStack_168.actions,uVar19,
                                   pTVar25->language);
                        _Var11 = ts_parser__select_tree
                                           (pTVar25,(Subtree)left,*(Subtree *)&pTVar25->scratch_tree
                                           );
                        if (_Var11) {
                          pSVar27 = (pTVar25->scratch_tree).ptr;
                          MVar26 = left;
                          for (lVar12 = 0xb; lVar12 != 0; lVar12 = lVar12 + -1) {
                            uVar19 = (pSVar27->padding).bytes;
                            *(uint32_t *)MVar26 = pSVar27->ref_count;
                            ((Length *)((long)MVar26 + 4))->bytes = uVar19;
                            pSVar27 = (SubtreeHeapData *)((long)pSVar27 + (ulong)bVar34 * -0x10 + 8)
                            ;
                            MVar26.data = MVar26.data + (ulong)bVar34 * -0x10 + 8;
                          }
                          ts_subtree_array_delete(pool,&SStack_148);
                          uStack_138 = uStack_158;
                          SStack_148.contents = (Subtree *)TStack_168.actions;
                          SStack_148._8_8_ = TStack_168._8_8_;
                        }
                        else {
                          ts_subtree_array_delete(pool,(SubtreeArray *)&TStack_168);
                        }
                        uVar17 = uVar22 + 1;
                        uStack_190 = uVar22;
                      } while ((uint)(uVar22 + 1) != uVar5);
                    }
                    piVar1 = &((left.ptr)->field_17).field_0.dynamic_precedence;
                    *piVar1 = *piVar1 + iStack_10c;
                    ((left.ptr)->field_17).field_0.alias_sequence_id = (uint16_t)in_R9D;
                    if ((pTVar25->stack->heads).size <= uVar29) {
                      __assert_fail("(uint32_t)version < (&self->heads)->size",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/third_party/tree-sitter/src/runtime/stack.c"
                                    ,0x198,"TSStateId ts_stack_state(const Stack *, StackVersion)");
                    }
                    uVar20 = ((pTVar25->stack->heads).contents[uVar29].node)->state;
                    if (symbol < 0xfffe) {
                      self_00 = pTVar25->language;
                      if ((extraout_EDX & 0xffff) < self_00->token_count) {
                        ts_language_table_entry(self_00,uVar20,symbol,&TStack_168);
                        if (TStack_168.action_count != 0) {
                          state_00 = *(TSStateId *)
                                      (TStack_168.actions + (TStack_168.action_count - 1));
                          bVar2 = *(byte *)((long)TStack_168.actions +
                                           (ulong)(TStack_168.action_count - 1) * 8 + 6);
                          if (((bVar2 & 0xf) == 0) || ((bVar2 & 0xf) == 3)) goto LAB_001378af;
                        }
                        goto LAB_0013785c;
                      }
                      state_00 = self_00->parse_table
                                 [(uint)uVar20 * self_00->symbol_count + (extraout_EDX & 0xffff)];
                    }
                    else {
LAB_0013785c:
                      state_00 = 0;
                    }
LAB_001378af:
                    if (1 < uVar4 || (uVar15 != 1 || cStack_a8 != '\0')) {
                      (left.ptr)->field_0x2c = (left.ptr)->field_0x2c | 0x18;
                      uVar20 = TS_TREE_STATE_NONE;
                    }
                    (left.ptr)->parse_state = uVar20;
                    ts_stack_push(pTVar25->stack,uVar29,(Subtree)left,false,state_00);
                    pSVar9 = SStack_148.contents;
                    uVar5 = (left.ptr)->child_count;
                    if (uVar5 < SStack_148.size) {
                      iVar18 = SStack_148.size - uVar5;
                      lVar12 = 0;
                      do {
                        ts_stack_push(pTVar25->stack,uVar29,pSVar9[(ulong)uVar5 + lVar12],false,
                                      state_00);
                        lVar12 = lVar12 + 1;
                      } while (iVar18 != (int)lVar12);
                    }
                    SVar10 = SStack_114;
                    pSVar31 = pSStack_150;
                    if ((int)uStack_120 != iVar21) {
                      version1 = 0;
                      do {
                        if ((SVar10 != version1) &&
                           (_Var11 = ts_stack_merge(pTVar25->stack,version1,uVar29), _Var11)) {
                          iVar21 = iVar21 + 1;
                          break;
                        }
                        version1 = version1 + 1;
                      } while (uVar29 != version1);
                    }
                    SVar35.size = (undefined4)uStack_128;
                    SVar35.capacity = uStack_128._4_4_;
                    SVar35.contents = pSVar31;
                    iVar18 = (int)uStack_190;
                  }
                  else {
                    ts_stack_remove_version(pTVar25->stack,uVar29);
                    ts_subtree_array_delete(pool,&SStack_148);
                    iVar21 = iVar21 + 1;
                    uVar29 = iVar18 + 1;
                    if (uVar29 < uVar5) {
                      iVar3 = (int)uStack_138;
                      uStack_158 = *(undefined8 *)&pSVar30[uVar29].version;
                      pSVar30 = pSVar30 + uVar29;
                      TStack_168.actions = (TSParseAction *)(pSVar30->subtrees).contents;
                      TStack_168.action_count = (pSVar30->subtrees).size;
                      TStack_168._12_4_ = (pSVar30->subtrees).capacity;
                      if ((int)uStack_158 == (int)uStack_138) {
                        uStack_120 = CONCAT44(uStack_120._4_4_,uVar29);
                        pSVar31 = pSStack_e8 + uVar29;
                        iVar6 = (int)uStack_f0;
                        iVar32 = 0;
                        do {
                          ts_subtree_array_delete(pool,(SubtreeArray *)&TStack_168);
                          if (iVar6 + iVar18 == iVar32) {
                            iVar18 = (int)uStack_120 - iVar32;
                            goto LAB_00137977;
                          }
                          uStack_158 = *(undefined8 *)&pSVar31->version;
                          TStack_168.actions = (TSParseAction *)(pSVar31->subtrees).contents;
                          TStack_168.action_count = (pSVar31->subtrees).size;
                          TStack_168._12_4_ = (pSVar31->subtrees).capacity;
                          iVar32 = iVar32 + -1;
                          pSVar31 = pSVar31 + 1;
                        } while ((int)uStack_158 == iVar3);
                        iVar18 = iVar18 - iVar32;
LAB_00137977:
                        SVar35.size = (undefined4)uStack_128;
                        SVar35.capacity = uStack_128._4_4_;
                        SVar35.contents = pSStack_150;
                      }
                    }
                  }
                  SVar7.size = (undefined4)uStack_128;
                  SVar7.capacity = uStack_128._4_4_;
                  SVar7.contents = pSStack_150;
                  uStack_190 = (ulong)(iVar18 + 1U);
                  if (SVar35.size <= iVar18 + 1U) {
                    return;
                  }
                } while( true );
              }
              (reusable_node->stack).contents = __ptr_00;
              (reusable_node->stack).capacity = uVar29;
              uVar4 = (reusable_node->stack).size;
              lookahead = local_40;
            }
          }
          (reusable_node->stack).size = uVar4 + 1;
          __ptr_00[uVar4].tree = *(pSVar27->field_17).field_0.children;
          __ptr_00[uVar4].child_index = 0;
          __ptr_00[uVar4].byte_offset = uVar5;
          uVar4 = (reusable_node->stack).size;
          uVar17 = (ulong)local_44;
          if (uVar4 != 0) goto LAB_001372ad;
          uVar4 = 0;
          SVar13.ptr = (SubtreeHeapData *)0x0;
        }
        else {
LAB_001372ad:
          SVar13 = (Subtree)(reusable_node->stack).contents[uVar4 - 1].tree.ptr;
        }
        if (((ulong)SVar13.ptr & 1) != 0) goto LAB_001372da;
        bVar33 = true;
      } while ((SVar13.ptr)->child_count != 0);
    }
    if (bVar33) {
LAB_001372da:
      pcStack_50 = (code *)0x1372ed;
      ts_subtree_release(&self->tree_pool,*(SubtreeHeapData **)lookahead);
      lookahead->ptr = (SubtreeHeapData *)SVar13;
      ts_subtree_retain(SVar13);
      return;
    }
  }
  return;
}

Assistant:

static void ts_parser__breakdown_lookahead(TSParser *self, Subtree *lookahead,
                                           TSStateId state, ReusableNode *reusable_node) {
  bool did_descend = false;
  Subtree tree = reusable_node_tree(reusable_node);
  while (ts_subtree_child_count(tree) > 0 && ts_subtree_parse_state(tree) != state) {
    LOG("state_mismatch sym:%s", TREE_NAME(tree));
    reusable_node_descend(reusable_node);
    tree = reusable_node_tree(reusable_node);
    did_descend = true;
  }

  if (did_descend) {
    ts_subtree_release(&self->tree_pool, *lookahead);
    *lookahead = tree;
    ts_subtree_retain(*lookahead);
  }
}